

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

int secp256k1_ec_seckey_verify(secp256k1_context *ctx,uchar *seckey)

{
  int overflow;
  int local_34;
  secp256k1_scalar local_30;
  
  secp256k1_scalar_set_b32(&local_30,seckey,&local_34);
  return (int)(((local_30.d[3] != 0 || local_30.d[1] != 0) ||
               (local_30.d[2] != 0 || local_30.d[0] != 0)) && local_34 == 0);
}

Assistant:

int secp256k1_ec_seckey_verify(const secp256k1_context* ctx, const unsigned char *seckey) {
    secp256k1_scalar sec;
    int ret;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(seckey != NULL);

    ret = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    secp256k1_scalar_clear(&sec);
    return ret;
}